

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_db_status(sqlite3 *db,int op,int *pCurrent,int *pHighwater,int resetFlag)

{
  Btree *p_00;
  long lVar1;
  uint uVar2;
  int iVar3;
  sqlite3_uint64 sVar4;
  Pager *pPager_00;
  undefined4 *in_RCX;
  uint *in_RDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  long in_FS_OFFSET;
  Pager *pPager_1;
  int i_2;
  Vdbe *pVdbe;
  HashElem *p_1;
  Schema *pSchema;
  int i_1;
  int nByte;
  Pager *pPager;
  Btree *pBt;
  int i;
  int totalUsed;
  LookasideSlot *p;
  int rc;
  u64 nRet;
  int nByte_2;
  int nByte_1;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  undefined4 in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  int local_84;
  long local_80;
  undefined8 *local_78;
  int local_68;
  int local_64;
  int local_50;
  uint local_4c;
  long *local_48;
  int local_40;
  int local_24;
  u64 local_18;
  uint local_10;
  uint local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_40 = 0;
  sqlite3_mutex_enter((sqlite3_mutex *)0x131c63);
  local_24 = in_ESI;
  switch(in_ESI) {
  case 0:
    uVar2 = sqlite3LookasideUsed
                      ((sqlite3 *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                       (int *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    *in_RDX = uVar2;
    if (in_R8D != 0) {
      local_48 = *(long **)(in_RDI + 0x1c0);
      if (local_48 != (long *)0x0) {
        for (; *local_48 != 0; local_48 = (long *)*local_48) {
        }
        *local_48 = *(long *)(in_RDI + 0x1b8);
        *(undefined8 *)(in_RDI + 0x1b8) = *(undefined8 *)(in_RDI + 0x1c0);
        *(undefined8 *)(in_RDI + 0x1c0) = 0;
      }
      local_48 = *(long **)(in_RDI + 0x1d0);
      if (local_48 != (long *)0x0) {
        for (; *local_48 != 0; local_48 = (long *)*local_48) {
        }
        *local_48 = *(long *)(in_RDI + 0x1c8);
        *(undefined8 *)(in_RDI + 0x1c8) = *(undefined8 *)(in_RDI + 0x1d0);
        *(undefined8 *)(in_RDI + 0x1d0) = 0;
      }
    }
    break;
  case 1:
  case 0xb:
    local_4c = 0;
    sqlite3BtreeEnterAll((sqlite3 *)0x131e33);
    for (local_50 = 0; local_50 < *(int *)(in_RDI + 0x28); local_50 = local_50 + 1) {
      p_00 = *(Btree **)(*(long *)(in_RDI + 0x20) + (long)local_50 * 0x20 + 8);
      if (p_00 != (Btree *)0x0) {
        sqlite3BtreePager(p_00);
        iVar3 = sqlite3PagerMemUsed((Pager *)CONCAT44(in_stack_ffffffffffffff64,
                                                      in_stack_ffffffffffffff60));
        local_64 = iVar3;
        if (in_ESI == 0xb) {
          local_64 = sqlite3BtreeConnectionCount(p_00);
          local_64 = iVar3 / local_64;
          in_stack_ffffffffffffff64 = iVar3;
        }
        local_4c = local_64 + local_4c;
      }
    }
    sqlite3BtreeLeaveAll((sqlite3 *)0x131eea);
    *in_RDX = local_4c;
    *in_RCX = 0;
    break;
  case 2:
    local_c = 0;
    sqlite3BtreeEnterAll((sqlite3 *)0x131f25);
    *(uint **)(in_RDI + 0x300) = &local_c;
    *(undefined8 *)(in_RDI + 0x1e8) = *(undefined8 *)(in_RDI + 0x1e0);
    for (local_68 = 0; local_68 < *(int *)(in_RDI + 0x28); local_68 = local_68 + 1) {
      lVar1 = *(long *)(*(long *)(in_RDI + 0x20) + (long)local_68 * 0x20 + 0x18);
      if (lVar1 != 0) {
        iVar3 = (*sqlite3Config.m.xRoundup)(0x20);
        local_c = iVar3 * (*(int *)(lVar1 + 0xc) + *(int *)(lVar1 + 0x3c) + *(int *)(lVar1 + 0x24) +
                          *(int *)(lVar1 + 0x54)) + local_c;
        sVar4 = sqlite3_msize((void *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60))
        ;
        local_c = local_c + (int)sVar4;
        sVar4 = sqlite3_msize((void *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60))
        ;
        local_c = local_c + (int)sVar4;
        sVar4 = sqlite3_msize((void *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60))
        ;
        local_c = local_c + (int)sVar4;
        sVar4 = sqlite3_msize((void *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60))
        ;
        local_c = local_c + (int)sVar4;
        for (local_78 = *(undefined8 **)(lVar1 + 0x40); local_78 != (undefined8 *)0x0;
            local_78 = (undefined8 *)*local_78) {
          sqlite3DeleteTrigger
                    ((sqlite3 *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                     (Trigger *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
        }
        for (local_78 = *(undefined8 **)(lVar1 + 0x10); local_78 != (undefined8 *)0x0;
            local_78 = (undefined8 *)*local_78) {
          sqlite3DeleteTable((sqlite3 *)
                             CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                             (Table *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58))
          ;
        }
      }
    }
    *(undefined8 *)(in_RDI + 0x300) = 0;
    *(undefined8 *)(in_RDI + 0x1e8) = *(undefined8 *)(in_RDI + 0x1f0);
    sqlite3BtreeLeaveAll((sqlite3 *)0x132143);
    *in_RCX = 0;
    *in_RDX = local_c;
    break;
  case 3:
    local_10 = 0;
    *(uint **)(in_RDI + 0x300) = &local_10;
    *(undefined8 *)(in_RDI + 0x1e8) = *(undefined8 *)(in_RDI + 0x1e0);
    for (local_80 = *(long *)(in_RDI + 8); local_80 != 0; local_80 = *(long *)(local_80 + 0x10)) {
      sqlite3VdbeDelete((Vdbe *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
    }
    *(undefined8 *)(in_RDI + 0x1e8) = *(undefined8 *)(in_RDI + 0x1f0);
    *(undefined8 *)(in_RDI + 0x300) = 0;
    *in_RCX = 0;
    *in_RDX = local_10;
    break;
  case 4:
  case 5:
  case 6:
    *in_RDX = 0;
    *in_RCX = *(undefined4 *)(in_RDI + 0x1a8 + (long)(in_ESI + -4) * 4);
    if (in_R8D != 0) {
      *(undefined4 *)(in_RDI + 0x1a8 + (long)(in_ESI + -4) * 4) = 0;
    }
    break;
  case 10:
    *in_RCX = 0;
    uVar2 = 0x1000000;
    if (*(long *)(in_RDI + 0x2f8) < 1) {
      uVar2 = (uint)(0 < *(long *)(in_RDI + 0x2f0)) << 0x18;
    }
    *in_RDX = uVar2 >> 0x18;
    break;
  case 0xc:
    local_24 = 10;
  case 7:
  case 8:
  case 9:
    local_18 = 0;
    for (local_84 = 0; local_84 < *(int *)(in_RDI + 0x28); local_84 = local_84 + 1) {
      if (*(long *)(*(long *)(in_RDI + 0x20) + (long)local_84 * 0x20 + 8) != 0) {
        pPager_00 = sqlite3BtreePager(*(Btree **)
                                       (*(long *)(in_RDI + 0x20) + (long)local_84 * 0x20 + 8));
        sqlite3PagerCacheStat(pPager_00,local_24,in_R8D,&local_18);
      }
    }
    *in_RCX = 0;
    *in_RDX = (uint)local_18 & 0x7fffffff;
    break;
  default:
    local_40 = 1;
  }
  sqlite3_mutex_leave((sqlite3_mutex *)0x132367);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_40;
}

Assistant:

SQLITE_API int sqlite3_db_status(
  sqlite3 *db,          /* The database connection whose status is desired */
  int op,               /* Status verb */
  int *pCurrent,        /* Write current value here */
  int *pHighwater,      /* Write high-water mark here */
  int resetFlag         /* Reset high-water mark if true */
){
  int rc = SQLITE_OK;   /* Return code */
#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) || pCurrent==0|| pHighwater==0 ){
    return SQLITE_MISUSE_BKPT;
  }
#endif
  sqlite3_mutex_enter(db->mutex);
  switch( op ){
    case SQLITE_DBSTATUS_LOOKASIDE_USED: {
      *pCurrent = sqlite3LookasideUsed(db, pHighwater);
      if( resetFlag ){
        LookasideSlot *p = db->lookaside.pFree;
        if( p ){
          while( p->pNext ) p = p->pNext;
          p->pNext = db->lookaside.pInit;
          db->lookaside.pInit = db->lookaside.pFree;
          db->lookaside.pFree = 0;
        }
#ifndef SQLITE_OMIT_TWOSIZE_LOOKASIDE
        p = db->lookaside.pSmallFree;
        if( p ){
          while( p->pNext ) p = p->pNext;
          p->pNext = db->lookaside.pSmallInit;
          db->lookaside.pSmallInit = db->lookaside.pSmallFree;
          db->lookaside.pSmallFree = 0;
        }
#endif
      }
      break;
    }

    case SQLITE_DBSTATUS_LOOKASIDE_HIT:
    case SQLITE_DBSTATUS_LOOKASIDE_MISS_SIZE:
    case SQLITE_DBSTATUS_LOOKASIDE_MISS_FULL: {
      testcase( op==SQLITE_DBSTATUS_LOOKASIDE_HIT );
      testcase( op==SQLITE_DBSTATUS_LOOKASIDE_MISS_SIZE );
      testcase( op==SQLITE_DBSTATUS_LOOKASIDE_MISS_FULL );
      assert( (op-SQLITE_DBSTATUS_LOOKASIDE_HIT)>=0 );
      assert( (op-SQLITE_DBSTATUS_LOOKASIDE_HIT)<3 );
      *pCurrent = 0;
      *pHighwater = db->lookaside.anStat[op - SQLITE_DBSTATUS_LOOKASIDE_HIT];
      if( resetFlag ){
        db->lookaside.anStat[op - SQLITE_DBSTATUS_LOOKASIDE_HIT] = 0;
      }
      break;
    }

    /*
    ** Return an approximation for the amount of memory currently used
    ** by all pagers associated with the given database connection.  The
    ** highwater mark is meaningless and is returned as zero.
    */
    case SQLITE_DBSTATUS_CACHE_USED_SHARED:
    case SQLITE_DBSTATUS_CACHE_USED: {
      int totalUsed = 0;
      int i;
      sqlite3BtreeEnterAll(db);
      for(i=0; i<db->nDb; i++){
        Btree *pBt = db->aDb[i].pBt;
        if( pBt ){
          Pager *pPager = sqlite3BtreePager(pBt);
          int nByte = sqlite3PagerMemUsed(pPager);
          if( op==SQLITE_DBSTATUS_CACHE_USED_SHARED ){
            nByte = nByte / sqlite3BtreeConnectionCount(pBt);
          }
          totalUsed += nByte;
        }
      }
      sqlite3BtreeLeaveAll(db);
      *pCurrent = totalUsed;
      *pHighwater = 0;
      break;
    }

    /*
    ** *pCurrent gets an accurate estimate of the amount of memory used
    ** to store the schema for all databases (main, temp, and any ATTACHed
    ** databases.  *pHighwater is set to zero.
    */
    case SQLITE_DBSTATUS_SCHEMA_USED: {
      int i;                      /* Used to iterate through schemas */
      int nByte = 0;              /* Used to accumulate return value */

      sqlite3BtreeEnterAll(db);
      db->pnBytesFreed = &nByte;
      assert( db->lookaside.pEnd==db->lookaside.pTrueEnd );
      db->lookaside.pEnd = db->lookaside.pStart;
      for(i=0; i<db->nDb; i++){
        Schema *pSchema = db->aDb[i].pSchema;
        if( ALWAYS(pSchema!=0) ){
          HashElem *p;

          nByte += sqlite3GlobalConfig.m.xRoundup(sizeof(HashElem)) * (
              pSchema->tblHash.count
            + pSchema->trigHash.count
            + pSchema->idxHash.count
            + pSchema->fkeyHash.count
          );
          nByte += sqlite3_msize(pSchema->tblHash.ht);
          nByte += sqlite3_msize(pSchema->trigHash.ht);
          nByte += sqlite3_msize(pSchema->idxHash.ht);
          nByte += sqlite3_msize(pSchema->fkeyHash.ht);

          for(p=sqliteHashFirst(&pSchema->trigHash); p; p=sqliteHashNext(p)){
            sqlite3DeleteTrigger(db, (Trigger*)sqliteHashData(p));
          }
          for(p=sqliteHashFirst(&pSchema->tblHash); p; p=sqliteHashNext(p)){
            sqlite3DeleteTable(db, (Table *)sqliteHashData(p));
          }
        }
      }
      db->pnBytesFreed = 0;
      db->lookaside.pEnd = db->lookaside.pTrueEnd;
      sqlite3BtreeLeaveAll(db);

      *pHighwater = 0;
      *pCurrent = nByte;
      break;
    }

    /*
    ** *pCurrent gets an accurate estimate of the amount of memory used
    ** to store all prepared statements.
    ** *pHighwater is set to zero.
    */
    case SQLITE_DBSTATUS_STMT_USED: {
      struct Vdbe *pVdbe;         /* Used to iterate through VMs */
      int nByte = 0;              /* Used to accumulate return value */

      db->pnBytesFreed = &nByte;
      assert( db->lookaside.pEnd==db->lookaside.pTrueEnd );
      db->lookaside.pEnd = db->lookaside.pStart;
      for(pVdbe=db->pVdbe; pVdbe; pVdbe=pVdbe->pVNext){
        sqlite3VdbeDelete(pVdbe);
      }
      db->lookaside.pEnd = db->lookaside.pTrueEnd;
      db->pnBytesFreed = 0;

      *pHighwater = 0;  /* IMP: R-64479-57858 */
      *pCurrent = nByte;

      break;
    }

    /*
    ** Set *pCurrent to the total cache hits or misses encountered by all
    ** pagers the database handle is connected to. *pHighwater is always set
    ** to zero.
    */
    case SQLITE_DBSTATUS_CACHE_SPILL:
      op = SQLITE_DBSTATUS_CACHE_WRITE+1;
      /* no break */ deliberate_fall_through
    case SQLITE_DBSTATUS_CACHE_HIT:
    case SQLITE_DBSTATUS_CACHE_MISS:
    case SQLITE_DBSTATUS_CACHE_WRITE:{
      int i;
      u64 nRet = 0;
      assert( SQLITE_DBSTATUS_CACHE_MISS==SQLITE_DBSTATUS_CACHE_HIT+1 );
      assert( SQLITE_DBSTATUS_CACHE_WRITE==SQLITE_DBSTATUS_CACHE_HIT+2 );

      for(i=0; i<db->nDb; i++){
        if( db->aDb[i].pBt ){
          Pager *pPager = sqlite3BtreePager(db->aDb[i].pBt);
          sqlite3PagerCacheStat(pPager, op, resetFlag, &nRet);
        }
      }
      *pHighwater = 0; /* IMP: R-42420-56072 */
                       /* IMP: R-54100-20147 */
                       /* IMP: R-29431-39229 */
      *pCurrent = (int)nRet & 0x7fffffff;
      break;
    }

    /* Set *pCurrent to non-zero if there are unresolved deferred foreign
    ** key constraints.  Set *pCurrent to zero if all foreign key constraints
    ** have been satisfied.  The *pHighwater is always set to zero.
    */
    case SQLITE_DBSTATUS_DEFERRED_FKS: {
      *pHighwater = 0;  /* IMP: R-11967-56545 */
      *pCurrent = db->nDeferredImmCons>0 || db->nDeferredCons>0;
      break;
    }

    default: {
      rc = SQLITE_ERROR;
    }
  }
  sqlite3_mutex_leave(db->mutex);
  return rc;
}